

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall
Memory::DefaultRecyclerCollectionWrapper::DisposeObjects
          (DefaultRecyclerCollectionWrapper *this,Recycler *recycler)

{
  bool bVar1;
  Data in_EAX;
  Data DVar2;
  undefined4 in_register_00000004;
  DebugCheckNoException local_18;
  DebugCheckNoException __debugCheckNoException;
  
  local_18._4_4_ = in_register_00000004;
  local_18.__exceptionCheck.handledExceptionType = in_EAX.handledExceptionType;
  bVar1 = IsCollectionDisabled(recycler);
  if (!bVar1) {
    local_18.hasException = true;
    DVar2 = ExceptionCheck::Save();
    local_18.__exceptionCheck.handledExceptionType = DVar2.handledExceptionType;
    Recycler::DisposeObjects(recycler);
    local_18.hasException = false;
    DebugCheckNoException::~DebugCheckNoException(&local_18);
  }
  return;
}

Assistant:

void
DefaultRecyclerCollectionWrapper::DisposeObjects(Recycler * recycler)
{
    if (IsCollectionDisabled(recycler))
    {
        return;
    }

    BEGIN_NO_EXCEPTION
    {
        recycler->DisposeObjects();
    }